

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

void __thiscall
LongReadsMapper::map_reads_to_best_nodes
          (LongReadsMapper *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *readIDs)

{
  __node_base *__s;
  byte bVar1;
  pointer pLVar2;
  pointer puVar3;
  pointer pvVar4;
  SatKmerIndex *this_00;
  NKmerIndex *this_01;
  ostream *poVar5;
  size_type sVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char *s;
  size_type __n;
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *pvVar14;
  LongReadsMapper *pLVar15;
  ulong uVar16;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *threadm;
  pointer pvVar17;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  vector<bool,_std::allocator<bool>_> kmer_in_assembly;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  thread_mappings;
  shared_ptr<NKmerIndex> nkindex;
  shared_ptr<SatKmerIndex> skindex;
  vector<chain,_std::allocator<chain>_> best_window_chain;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  ReadSequenceBuffer sequenceGetter;
  StreamKmerFactory skf;
  bool local_3c5;
  key_type_conflict3 local_3c4;
  int local_3c0;
  allocator_type local_3b9;
  undefined1 local_3b8 [8];
  SequenceDistanceGraph *pSStack_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  LongReadsDatastore *local_390;
  pointer local_388;
  vector<bool,_std::allocator<bool>_> local_380;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  local_358;
  __shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2> local_338;
  __shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2> local_328;
  vector<chain,_std::allocator<chain>_> local_318;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_2f8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_2d8;
  LongReadsMapper *local_2d0;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_2c8;
  long local_2c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b8;
  LongReadsMapper local_2a0;
  undefined1 local_1cf;
  undefined1 local_1cd;
  undefined1 local_1c9;
  undefined1 local_1bc;
  char local_130 [65];
  undefined1 local_ef;
  undefined1 local_ed;
  undefined1 local_e9;
  undefined1 local_dc;
  undefined1 local_cf;
  undefined1 local_cd;
  undefined1 local_c9;
  undefined1 local_bc;
  
  pLVar2 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl
      .super__Vector_impl_data._M_finish != pLVar2) {
    (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar2;
  }
  local_338._M_ptr = (NKmerIndex *)0x0;
  local_338._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_328._M_ptr = (SatKmerIndex *)0x0;
  local_328._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this->sat_kmer_index == true) {
    this_00 = (SatKmerIndex *)operator_new(0x38);
    SatKmerIndex::SatKmerIndex(this_00,this->sg,this->k,(uint8_t)this->max_index_freq);
    std::__shared_ptr<SatKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<SatKmerIndex>
              (&local_328,this_00);
  }
  else {
    this_01 = (NKmerIndex *)operator_new(0x50);
    NKmerIndex::NKmerIndex(this_01,this->sg,this->k,this->max_index_freq);
    std::__shared_ptr<NKmerIndex,_(__gnu_cxx::_Lock_policy)2>::reset<NKmerIndex>(&local_338,this_01)
    ;
  }
  poVar5 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Index created",0xd);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_358.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_358.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  local_358.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_358.
       super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  ((local_358.
    super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_358.
    super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_358.
    super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a0.mappings.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = this->k;
  __s = &local_2a0.all_paths_between._M_h._M_before_begin;
  local_2a0.all_paths_between._M_h._M_buckets =
       (__buckets_ptr)
       ~(-1L << ((byte)((uint)(byte)local_2a0.mappings.
                                    super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 2) & 0x3f))
  ;
  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0.all_paths_between._M_h._M_bucket_count =
       (ulong)((uint)(byte)local_2a0.mappings.
                           super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage * 2) - 2;
  local_358.
  super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_358.
       super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8 = local_358.
              super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  memset(__s,0,0x100);
  local_2a0.all_paths_between._M_h._M_before_begin._M_nxt._0_1_ = 4;
  memset(local_130,0,0x100);
  memset(__s,4,0xff);
  memset(local_130,4,0xff);
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
  local_1cf = 0;
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._3_1_ = 1;
  local_1cd = 1;
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = 2;
  local_1c9 = 2;
  local_2a0.reads_in_node.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 3;
  local_1bc = 3;
  local_ef = 3;
  local_cf = 3;
  local_ed = 2;
  local_cd = 2;
  local_e9 = 1;
  local_c9 = 1;
  local_dc = 0;
  local_bc = 0;
  local_3a8 = 0;
  local_3b8 = (undefined1  [8])0x0;
  pSStack_3b0 = (SequenceDistanceGraph *)0x0;
  ReadSequenceBuffer::ReadSequenceBuffer
            ((ReadSequenceBuffer *)&local_2a0,this->datastore,0x1e00000,0x400000);
  local_2f8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_2b8,
             ((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x2492492492492492,
             (allocator_type *)&local_380);
  local_318.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_318.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_318.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::chrono::_V2::system_clock::now();
  local_3c4 = 1;
  if ((long)(this->datastore->read_to_fileRecord).
            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->datastore->read_to_fileRecord).
            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    local_388 = (pointer)0x0;
    local_390 = (LongReadsDatastore *)0x0;
    local_3a0 = 0;
    local_398 = 0;
  }
  else {
    local_3c0 = 0;
    local_398 = 0;
    local_3a0 = 0;
    local_390 = (LongReadsDatastore *)0x0;
    local_388 = (pointer)0x0;
    local_2d8 = readIDs;
    local_2d0 = this;
    do {
      local_2c0 = std::chrono::_V2::system_clock::now();
      local_3c0 = local_3c0 + 1;
      if (((uint)(local_3c0 * 0x3afb7e91) >> 4 | local_3c0 * 0x10000000) < 0x68db9) {
        poVar5 = sdglib::OutputLog(INFO,true);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Thread #",8);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," processing its read #",0x16);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      if (*(long *)((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)readIDs + 0x18) == 0) {
LAB_001a51d1:
        if ((uint)(this->min_size * 2) <=
            (this->datastore->read_to_fileRecord).
            super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
            super__Vector_impl_data._M_start[local_3c4].record_size) {
          pLVar15 = &local_2a0;
          pbVar7 = (byte *)ReadSequenceBuffer::get_read_sequence
                                     ((ReadSequenceBuffer *)pLVar15,(ulong)local_3c4);
          if ((undefined1  [8])pSStack_3b0 != local_3b8) {
            pSStack_3b0 = (SequenceDistanceGraph *)local_3b8;
          }
          local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          while( true ) {
            bVar1 = *pbVar7;
            if ((bVar1 == 0) || (bVar1 == 10)) break;
            lVar12 = (long)*(char *)((long)&local_2a0.all_paths_between._M_h._M_before_begin._M_nxt
                                    + (ulong)bVar1);
            if (lVar12 == 4) {
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              uVar8 = (long)local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage << 2;
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((3L << ((byte)local_2a0.all_paths_between._M_h._M_bucket_count & 0x3f))
                            + ((ulong)local_2a0.first_mapping.
                                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                      super__Vector_impl_data._M_finish >> 2));
            }
            else {
              uVar8 = lVar12 + (long)local_2a0.first_mapping.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage * 4;
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)(((long)local_130[bVar1] <<
                             ((byte)local_2a0.all_paths_between._M_h._M_bucket_count & 0x3f)) +
                            ((ulong)local_2a0.first_mapping.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_finish >> 2));
              local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((long)local_2a0.first_mapping.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start + 1);
            }
            local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(uVar8 & (ulong)local_2a0.all_paths_between._M_h._M_buckets);
            if ((long)(ulong)(byte)local_2a0.mappings.
                                   super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage <=
                (long)local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
              pLVar15 = (LongReadsMapper *)local_3b8;
              if (local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage <
                  local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                     (_Bit_type *)
                     ((ulong)local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_
                     << 8);
                std::
                vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                ::emplace_back<bool,unsigned_long&>
                          ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                            *)local_3b8,(bool *)&local_380,
                           (unsigned_long *)
                           &local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                     (_Bit_type *)
                     CONCAT71(local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                              1);
                std::
                vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                ::emplace_back<bool,unsigned_long&>
                          ((vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>
                            *)local_3b8,(bool *)&local_380,
                           (unsigned_long *)
                           &local_2a0.first_mapping.super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
              }
            }
            pbVar7 = pbVar7 + 1;
          }
          __n = (long)pSStack_3b0 - (long)local_3b8 >> 4;
          if ((ulong)((long)this->min_size * 2) <= __n) {
            if (this->sat_kmer_index == true) {
              get_sat_kmer_matches
                        (pLVar15,local_328._M_ptr,&local_2f8,
                         (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          *)local_3b8);
            }
            else {
              local_3c5 = false;
              std::vector<bool,_std::allocator<bool>_>::vector(&local_380,__n,&local_3c5,&local_3b9)
              ;
              if ((long)pSStack_3b0 - (long)local_3b8 != 0) {
                lVar12 = (long)pSStack_3b0 - (long)local_3b8 >> 4;
                uVar16 = (ulong)((local_338._M_ptr)->bfilter).dataSz;
                puVar3 = ((local_338._M_ptr)->bfilter).data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pvVar14 = &((DistanceGraph *)local_3b8)->links;
                uVar8 = 0;
                do {
                  uVar13 = (ulong)(pvVar14->
                                  super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start %
                           ((local_338._M_ptr)->bfilter).estimated_size;
                  uVar9 = uVar8 + 0x3f;
                  if (-1 < (long)uVar8) {
                    uVar9 = uVar8;
                  }
                  lVar11 = (long)uVar9 >> 6;
                  uVar9 = 1L << ((byte)uVar8 & 0x3f);
                  lVar10 = (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
                  if ((puVar3[uVar13 / uVar16] >> ((byte)(7 - (char)(uVar13 % uVar16)) & 0x1f) & 1)
                      == 0) {
                    uVar9 = ~uVar9 & *(ulong *)((long)local_380.
                                                      super__Bvector_base<std::allocator<bool>_>.
                                                      _M_impl.super__Bvector_impl_data._M_start.
                                                      super__Bit_iterator_base._M_p +
                                               lVar10 + lVar11 * 8);
                  }
                  else {
                    uVar9 = uVar9 | *(ulong *)((long)local_380.
                                                     super__Bvector_base<std::allocator<bool>_>.
                                                     _M_impl.super__Bvector_impl_data._M_start.
                                                     super__Bit_iterator_base._M_p +
                                              lVar10 + lVar11 * 8);
                  }
                  *(ulong *)((long)local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            lVar10 + lVar11 * 8) = uVar9;
                  uVar8 = uVar8 + 1;
                  pvVar14 = (vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                             *)&(pvVar14->
                                super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_end_of_storage;
                } while (lVar12 + (ulong)(lVar12 == 0) != uVar8);
              }
              get_all_kmer_matches
                        (this,local_338._M_ptr,&local_2f8,
                         (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                          *)local_3b8,&local_380);
              readIDs = local_2d8;
              if ((pointer)local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (pointer)0x0) {
                operator_delete(local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                                (long)local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_end_of_storage -
                                (long)local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p);
                local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                local_380.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
              }
            }
            lVar12 = std::chrono::_V2::system_clock::now();
            window_internal_chaining
                      (&local_318,(uint32_t)((ulong)((long)pSStack_3b0 - (long)local_3b8) >> 4),
                       &local_2f8,100);
            lVar10 = std::chrono::_V2::system_clock::now();
            window_external_chaining
                      (local_3c4,(long)pSStack_3b0 - (long)local_3b8 >> 4,local_2c8,&local_318,
                       &local_2f8,100);
            lVar11 = std::chrono::_V2::system_clock::now();
            local_398 = (local_398 - local_2c0) + lVar12;
            local_3a0 = (local_3a0 - lVar12) + lVar10;
            local_390 = (LongReadsDatastore *)((long)local_390 + (lVar11 - lVar10));
            local_388 = (pointer)((long)local_388 + (lVar11 - local_2c0));
            this = local_2d0;
          }
        }
      }
      else {
        sVar6 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)readIDs,&local_3c4);
        if (sVar6 != 0) goto LAB_001a51d1;
      }
      local_3c4 = local_3c4 + 1;
    } while ((ulong)local_3c4 <=
             ((long)(this->datastore->read_to_fileRecord).
                    super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->datastore->read_to_fileRecord).
                    super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4) - 1U);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Thread #",8);
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," times: ",8);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," total, ",8);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%)kmer-hit search, ",0x13);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%)internal chaining, ",0x15);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%)external chaining",0x13);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_318.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_318.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.super__Vector_base<chain,_std::allocator<chain>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_2f8);
  ReadSequenceBuffer::~ReadSequenceBuffer((ReadSequenceBuffer *)&local_2a0);
  if (local_3b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_3b8,local_3a8 - (long)local_3b8);
  }
  pvVar4 = local_358.
           super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_358.
      super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_358.
      super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar17 = local_358.
              super__Vector_base<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>>
                ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)&this->mappings,
                 (this->mappings).
                 super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (pvVar17->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                 _M_impl.super__Vector_impl_data._M_start,
                 (pvVar17->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                 _M_impl.super__Vector_impl_data._M_finish);
      pvVar17 = pvVar17 + 1;
    } while (pvVar17 != pvVar4);
  }
  poVar5 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Updating mapping indexes",0x18);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  update_indexes(this);
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::~vector(&local_358);
  if (local_328._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328._M_refcount._M_pi);
  }
  if (local_338._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338._M_refcount._M_pi);
  }
  return;
}

Assistant:

void LongReadsMapper::map_reads_to_best_nodes(const std::unordered_set<uint32_t> &readIDs) {
    mappings.clear();
    std::shared_ptr<NKmerIndex> nkindex;
    std::shared_ptr<SatKmerIndex> skindex;
    if (sat_kmer_index) skindex.reset(new SatKmerIndex(sg,k,max_index_freq));
    else nkindex.reset(new NKmerIndex(sg,k,max_index_freq));
    sdglib::OutputLog() << "Index created" << std::endl;
    std::vector<std::vector<LongReadMapping>> thread_mappings(omp_get_max_threads());
    uint32_t num_reads_done(0);
    uint64_t no_matches(0),single_matches(0),multi_matches(0);
#pragma omp parallel default(none) shared(thread_mappings,nkindex,skindex,no_matches,single_matches,multi_matches,num_reads_done,readIDs) shared(std::cout)
    {
        StreamKmerFactory skf(k);
        std::vector<std::pair<bool, uint64_t>> read_kmers;

        auto & private_results=thread_mappings[omp_get_thread_num()];
        ReadSequenceBuffer sequenceGetter(datastore);
        std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
        const char * query_sequence_ptr;

        std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);
        std::vector<chain> best_window_chain;
        auto t=std::chrono::high_resolution_clock::now();
        auto tkhits=t-t,tichain=t-t,techain=t-t,ttoal=t-t;

#pragma omp for schedule(static,200) reduction(+:no_matches,single_matches,multi_matches,num_reads_done)
        for (uint32_t readID = 1; readID <= datastore.size(); ++readID) {
        //for (uint32_t readID = 598822; readID < 598823; ++readID) {
        //for (uint32_t readID = 3024; readID < 3024; ++readID) {

            auto t0=std::chrono::high_resolution_clock::now();
            if (++num_reads_done%10000 == 0) {
                sdglib::OutputLog() << "Thread #"<<omp_get_thread_num() <<" processing its read #" << num_reads_done << std::endl;
            }

            if ((!readIDs.empty() and readIDs.count(readID)==0 /*Read not in selected set*/)) {
                continue;
            }
            if (datastore.read_to_fileRecord[readID].record_size< 2 * min_size ) continue;
            //========== 1. Get read sequence, kmerise, get all matches ==========
            query_sequence_ptr = sequenceGetter.get_read_sequence(readID);
            read_kmers.clear();
            skf.produce_all_kmers(query_sequence_ptr, read_kmers);

            if ( read_kmers.size()< 2 * min_size) {
                continue;
            }

            // Create a vector for the lookup of read_kmers in the filter, then sort the ones that are in the filter
            // generate_matches using a sorted version which will make the lookups faster

            // sort them back in the order they came out of the reads

            if (sat_kmer_index) {
                get_sat_kmer_matches(*skindex,node_matches, read_kmers);
            } else {
                std::vector<bool> kmer_in_assembly(read_kmers.size());

                for (uint64_t i = 0; i < read_kmers.size(); ++i) {
                    kmer_in_assembly[i] = nkindex->filter(read_kmers[i].second);
                }
                get_all_kmer_matches(*nkindex, node_matches, read_kmers, kmer_in_assembly);
            }

            //========== 2. Find best chaining in fixed windows ==========
            //std::cout<<"Internal chaining for "<<readID<<std::endl;
            auto t1=std::chrono::high_resolution_clock::now();
            window_internal_chaining(best_window_chain,read_kmers.size(),node_matches,100);
            //std::cout<<"Best window matches for read #"<<readID<<std::endl;
//            for (auto bwc:best_window_chain) {
//                std::cout<<"Node: "<<bwc.node<<" Delta: "<<bwc.delta<<" Score: "<<bwc.score<<std::endl;
//            }
//            std::cout<<std::endl;
            //std::cout<<"External chaining for "<<readID<<std::endl;
            auto t2=std::chrono::high_resolution_clock::now();
            window_external_chaining(readID,read_kmers.size(),private_results,best_window_chain,node_matches,100);
//            for (auto r:private_results){
//                std::cout<<r<<std::endl;
//            }
            auto t3=std::chrono::high_resolution_clock::now();
            //private_results.insert(private_results.end(),fblocks.begin(),fblocks.end());
            tkhits+=t1-t0;
            tichain+=t2-t1;
            techain+=t3-t2;
            ttoal+=t3-t0;
        }
#pragma omp critical
        std::cout<<"Thread #"<<omp_get_thread_num()<<" times: "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(ttoal).count()<<" total, "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(tkhits).count()<<" ("<<100*tkhits/ttoal<<"%)kmer-hit search, "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(tichain).count()<<" ("<<100*tichain/ttoal<<"%)internal chaining, "
            <<std::chrono::duration_cast<std::chrono::milliseconds>(techain).count()<<" ("<<100*techain/ttoal<<"%)external chaining"<<std::endl;
    }
    //TODO: report read and win coverage by winners vs. by loosers
//    sdglib::OutputLog()<<"Read window results:    "<<window_low_score<<" low score    "<<window_close_second<<" close second    "<<window_hit<<" hits"<<std::endl;
//    sdglib::OutputLog()<<"Read results:    "<<no_matches<<" no match    "<<single_matches<<" single match    "<<multi_matches<<" multi matches"<<std::endl;
    for (auto & threadm : thread_mappings) {
        mappings.insert(mappings.end(),threadm.begin(),threadm.end());
    }
    sdglib::OutputLog() << "Updating mapping indexes" <<std::endl;
    update_indexes();
}